

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

void __thiscall SceneParser::SceneParser(SceneParser *this,string *filename)

{
  string *this_00;
  bool bVar1;
  long lVar2;
  FILE *pFVar3;
  Sampler *pSVar4;
  undefined8 extraout_RAX;
  allocator local_a9;
  string local_a8;
  string ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_basepath)._M_dataplus._M_p = (pointer)&(this->_basepath).field_2;
  (this->_basepath)._M_string_length = 0;
  this_00 = &this->_basepath;
  (this->_basepath).field_2._M_local_buf[0] = '\0';
  this->_file = (FILE *)0x0;
  this->_camera = (Camera *)0x0;
  Vector3f::Vector3f(&this->_background_color,0.5,0.5,0.5);
  Vector3f::Vector3f(&this->_ambient_light,0.0,0.0,0.0);
  this->_group = (Group *)0x0;
  this->_cubemap = (CubeMap *)0x0;
  (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_current_material = (Material *)0x0;
  (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_num_lights = 0;
  this->_num_materials = 0;
  (this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (filename->_M_string_length == 0) {
    __assert_fail("!filename.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x23,"SceneParser::SceneParser(const std::string &)");
  }
  if (filename->_M_string_length < 5) {
    std::__cxx11::string::string
              ((string *)&ext,"ERROR: Wrong file name extension\n",(allocator *)&local_a8);
    _PostError(&ext);
  }
  else {
    lVar2 = std::__cxx11::string::find_last_of((char *)filename,0x12eed5);
    if (lVar2 == -1) {
      std::__cxx11::string::assign((char *)this_00);
    }
    else {
      std::__cxx11::string::substr((ulong)&ext,(ulong)filename);
      std::__cxx11::string::operator=((string *)this_00,(string *)&ext);
      std::__cxx11::string::~string((string *)&ext);
    }
    std::__cxx11::string::substr((ulong)&ext,(ulong)filename);
    bVar1 = std::operator!=(&ext,".txt");
    if (!bVar1) {
      pFVar3 = fopen((filename->_M_dataplus)._M_p,"r");
      this->_file = (FILE *)pFVar3;
      if (pFVar3 != (FILE *)0x0) {
        parseFile(this);
        fclose((FILE *)this->_file);
        this->_file = (FILE *)0x0;
        if ((this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->lights).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::operator<<((ostream *)&std::cerr,"WARNING: No lights specified\n");
          Vector3f::Vector3f((Vector3f *)&local_a8,1.0,1.0,1.0);
          Vector3f::operator=(&this->_ambient_light,(Vector3f *)&local_a8);
        }
        pSVar4 = (Sampler *)operator_new(8);
        pSVar4->_vptr_Sampler = (_func_int **)&PTR__Sampler_0013acc8;
        this->sampler = pSVar4;
        std::__cxx11::string::~string((string *)&ext);
        return;
      }
      goto LAB_00124bb8;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_a8,"ERROR: Wrong file name extension\n",(allocator *)&local_68);
  _PostError(&local_a8);
LAB_00124bb8:
  std::__cxx11::string::string((string *)&local_48,"Cannot open scene file ",&local_a9);
  std::operator+(&local_68,&local_48,filename);
  std::operator+(&local_a8,&local_68,"\n");
  _PostError(&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&ext);
  std::_Vector_base<Object3D_*,_std::allocator<Object3D_*>_>::~_Vector_base
            (&(this->_objects).super__Vector_base<Object3D_*,_std::allocator<Object3D_*>_>);
  std::_Vector_base<Material_*,_std::allocator<Material_*>_>::~_Vector_base
            (&(this->_materials).super__Vector_base<Material_*,_std::allocator<Material_*>_>);
  std::__cxx11::string::~string((string *)this_00);
  std::_Vector_base<Object3D_*,_std::allocator<Object3D_*>_>::~_Vector_base
            ((_Vector_base<Object3D_*,_std::allocator<Object3D_*>_> *)this);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

SceneParser::SceneParser(const std::string &filename) :
        _file(NULL),
        _camera(NULL),
        _background_color(0.5, 0.5, 0.5),
        _ambient_light(0, 0, 0),
        _num_lights(0),
        _num_materials(0),
        _current_material(NULL),
        _group(NULL),
        _cubemap(NULL) {
    // Parse the file.
    assert(!filename.empty());

    if (filename.size() <= 4) {
        _PostError("ERROR: Wrong file name extension\n");
    }

    size_t last_sep = filename.find_last_of("\\/");
    if (last_sep == std::string::npos) {
        _basepath = "";
    } else {
        _basepath = filename.substr(0, last_sep + 1);
    }

    std::string ext = filename.substr(filename.size() - 4, 4);
    if (ext != ".txt") {
        _PostError("ERROR: Wrong file name extension\n");
    }

    _file = fopen(filename.c_str(), "r");

    // FIXME extract base path from scene file path
    if (_file == NULL) {
        _PostError(std::string("Cannot open scene file ") + filename + "\n");
    }

    parseFile();
    fclose(_file);
    _file = NULL;

    // If no lights are specified, set ambient light to white
    // (do solid color ray casting).
    if (lights.empty()) {
        std::cerr << "WARNING: No lights specified\n";
        _ambient_light = Vector3f(1, 1, 1);
    }

    sampler = new experimental;
}